

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu2.c
# Opt level: O3

MPP_RET vdpu2_h264d_init(void *hal,MppHalCfg *cfg)

{
  int iVar1;
  MPP_RET MVar2;
  void *pvVar3;
  void *pvVar4;
  MppBuffer *buffer;
  ulong uVar5;
  bool bVar6;
  undefined4 uVar7;
  
  if (hal == (void *)0x0) {
    if ((hal_h264d_debug & 4) == 0) {
      return MPP_OK;
    }
    _mpp_log_l(4,"hal_h264d_vdpu_reg","input empty(%d).\n",(char *)0x0,0x324);
    return MPP_OK;
  }
  pvVar3 = mpp_osal_calloc("vdpu2_h264d_init",0x1150);
  *(void **)((long)hal + 0x40) = pvVar3;
  if (pvVar3 == (void *)0x0) {
    if ((hal_h264d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h264d_vdpu_reg","malloc buffer error(%d).\n",(char *)0x0,0x328);
    }
    MVar2 = MPP_ERR_MALLOC;
    if ((hal_h264d_debug & 2) == 0) goto LAB_001dc0bc;
    uVar7 = 0x328;
  }
  else {
    pvVar3 = mpp_osal_calloc("vdpu2_h264d_init",0xb8);
    *(void **)((long)hal + 0x90) = pvVar3;
    if (pvVar3 != (void *)0x0) {
      iVar1 = *(int *)((long)hal + 0x98);
      buffer = (MppBuffer *)((long)pvVar3 + 8);
      uVar5 = 0;
      do {
        MVar2 = mpp_buffer_get_with_tag
                          (*(MppBufferGroup *)((long)hal + 0x68),buffer,0xfc8,"hal_h264d_vdpu_reg",
                           "vdpu2_h264d_init");
        if (MVar2 < MPP_OK) {
          if ((hal_h264d_debug & 4) != 0) {
            _mpp_log_l(4,"hal_h264d_vdpu_reg","Function error(%d).\n",(char *)0x0,0x332);
          }
          goto LAB_001dc0bc;
        }
        pvVar4 = mpp_buffer_get_ptr_with_caller(*buffer,"vdpu2_h264d_init");
        buffer[1] = pvVar4;
        buffer[2] = (MppBuffer)((long)pvVar4 + 0xe60);
        buffer[3] = (MppBuffer)((long)pvVar4 + 0xee8);
        pvVar4 = mpp_osal_calloc("vdpu2_h264d_init",0x27c);
        buffer[4] = pvVar4;
        memcpy(buffer[1],vdpu_cabac_table,0xe60);
        if (iVar1 == 0) break;
        buffer = buffer + 6;
        bVar6 = uVar5 < 2;
        uVar5 = uVar5 + 1;
      } while (bVar6);
      if (*(int *)((long)hal + 0x98) == 0) {
        *(undefined8 *)((long)pvVar3 + 0x90) = *(undefined8 *)((long)pvVar3 + 8);
        *(undefined8 *)((long)pvVar3 + 0x98) = *(undefined8 *)((long)pvVar3 + 0x10);
        *(undefined8 *)((long)pvVar3 + 0xa0) = *(undefined8 *)((long)pvVar3 + 0x18);
        *(undefined8 *)((long)pvVar3 + 0xa8) = *(undefined8 *)((long)pvVar3 + 0x20);
        *(undefined8 *)((long)pvVar3 + 0xb0) = *(undefined8 *)((long)pvVar3 + 0x28);
      }
      mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_HOR_ALIGN,vdpu_hor_align);
      mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_VER_ALIGN,vdpu_ver_align);
      return MPP_OK;
    }
    if ((hal_h264d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h264d_vdpu_reg","malloc buffer error(%d).\n",(char *)0x0,0x329);
    }
    MVar2 = MPP_ERR_MALLOC;
    if ((hal_h264d_debug & 2) == 0) goto LAB_001dc0bc;
    uVar7 = 0x329;
  }
  MVar2 = MPP_ERR_MALLOC;
  _mpp_log_l(2,"hal_h264d_vdpu_reg","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
             "vdpu2_h264d_init",uVar7);
  if ((mpp_debug._3_1_ & 0x10) != 0) {
    abort();
  }
LAB_001dc0bc:
  vdpu2_h264d_deinit(hal);
  return MVar2;
}

Assistant:

MPP_RET vdpu2_h264d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t  *p_hal = (H264dHalCtx_t *)hal;
    INP_CHECK(ret, NULL == hal);
    (void) cfg;

    MEM_CHECK(ret, p_hal->priv = mpp_calloc_size(void,
                                                 sizeof(H264dVdpuPriv_t)));
    MEM_CHECK(ret, p_hal->reg_ctx = mpp_calloc_size(void, sizeof(H264dVdpuRegCtx_t)));
    H264dVdpuRegCtx_t *reg_ctx = (H264dVdpuRegCtx_t *)p_hal->reg_ctx;
    //!< malloc buffers
    {
        RK_U32 i = 0;
        RK_U32 loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;

        RK_U32 buf_size = VDPU_CABAC_TAB_SIZE +  VDPU_POC_BUF_SIZE + VDPU_SCALING_LIST_SIZE;
        for (i = 0; i < loop; i++) {
            FUN_CHECK(ret = mpp_buffer_get(p_hal->buf_group, &reg_ctx->reg_buf[i].buf,  buf_size));
            reg_ctx->reg_buf[i].cabac_ptr = mpp_buffer_get_ptr(reg_ctx->reg_buf[i].buf);
            reg_ctx->reg_buf[i].poc_ptr = reg_ctx->reg_buf[i].cabac_ptr + VDPU_CABAC_TAB_SIZE;
            reg_ctx->reg_buf[i].sclst_ptr = reg_ctx->reg_buf[i].poc_ptr + VDPU_POC_BUF_SIZE;
            reg_ctx->reg_buf[i].regs = mpp_calloc_size(void, sizeof(H264dVdpuRegs_t));
            //!< copy cabac table bytes
            memcpy(reg_ctx->reg_buf[i].cabac_ptr, (void *)vdpu_cabac_table,  sizeof(vdpu_cabac_table));
        }
    }

    if (!p_hal->fast_mode) {
        reg_ctx->buf = reg_ctx->reg_buf[0].buf;
        reg_ctx->cabac_ptr = reg_ctx->reg_buf[0].cabac_ptr;
        reg_ctx->poc_ptr = reg_ctx->reg_buf[0].poc_ptr;
        reg_ctx->sclst_ptr = reg_ctx->reg_buf[0].sclst_ptr;
        reg_ctx->regs = reg_ctx->reg_buf[0].regs;
    }

    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, vdpu_hor_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_VER_ALIGN, vdpu_ver_align);

__RETURN:
    return MPP_OK;
__FAILED:
    vdpu2_h264d_deinit(hal);

    return ret;
}